

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O1

void __thiscall so_5::coop_t::~coop_t(coop_t *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->_vptr_coop_t = (_func_int **)&PTR__coop_t_0028a520;
  std::
  vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
  ::_M_erase_at_end(&this->m_agent_array,
                    (this->m_agent_array).
                    super__Vector_base<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  delete_user_resources(this);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_resource_deleters);
  intrusive_ptr_t<so_5::coop_dereg_notificators_container_t>::dismiss_object
            (&this->m_dereg_notificators);
  intrusive_ptr_t<so_5::coop_reg_notificators_container_t>::dismiss_object
            (&this->m_reg_notificators);
  pcVar1 = (this->m_parent_coop_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_parent_coop_name).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
  ::~vector(&this->m_agent_array);
  this_00 = (this->m_coop_disp_binder).
            super___shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->m_coop_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_coop_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

coop_t::~coop_t()
{
	// Initiate deleting of agents by hand to guarantee that
	// agents will be destroyed before return from coop_t
	// destructor.
	//
	// NOTE: because agents are stored here by smart references
	// for some agents this operation will lead only to reference
	// counter descrement. Not to deletion of agent.
	m_agent_array.clear();

	// Now all user resources should be destroyed.
	delete_user_resources();
}